

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cpp
# Opt level: O2

string * __thiscall CInv::GetCommand_abi_cxx11_(string *__return_storage_ptr__,CInv *this)

{
  long lVar1;
  uint uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  out_of_range *this_00;
  long in_FS_OFFSET;
  string local_60;
  string cmd;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  cmd._M_dataplus._M_p = (pointer)&cmd.field_2;
  cmd._M_string_length = 0;
  cmd.field_2._M_local_buf[0] = '\0';
  uVar2 = this->type;
  if ((uVar2 >> 0x1e & 1) != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
              (&cmd,"witness-");
    uVar2 = this->type;
  }
  uVar2 = (uVar2 & 0x3fffffff) - 1;
  if (uVar2 < 5) {
    __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&cmd,&DAT_0071a3c0 + *(int *)(&DAT_0071a3c0 + (ulong)uVar2 * 4));
    std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
    std::__cxx11::string::~string((string *)&cmd);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      return __return_storage_ptr__;
    }
  }
  else {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    tinyformat::format<unsigned_int>
              (&local_60,"CInv::GetCommand(): type=%d unknown type",&this->type);
    std::out_of_range::out_of_range(this_00,(string *)&local_60);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
  }
  __stack_chk_fail();
}

Assistant:

std::string CInv::GetCommand() const
{
    std::string cmd;
    if (type & MSG_WITNESS_FLAG)
        cmd.append("witness-");
    int masked = type & MSG_TYPE_MASK;
    switch (masked)
    {
    case MSG_TX:             return cmd.append(NetMsgType::TX);
    // WTX is not a message type, just an inv type
    case MSG_WTX:            return cmd.append("wtx");
    case MSG_BLOCK:          return cmd.append(NetMsgType::BLOCK);
    case MSG_FILTERED_BLOCK: return cmd.append(NetMsgType::MERKLEBLOCK);
    case MSG_CMPCT_BLOCK:    return cmd.append(NetMsgType::CMPCTBLOCK);
    default:
        throw std::out_of_range(strprintf("CInv::GetCommand(): type=%d unknown type", type));
    }
}